

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<rangeless::fn::impl::X> __thiscall
rangeless::fn::impl::to_seq::
gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::operator()
          (gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> *this)

{
  bool bVar1;
  reference pXVar2;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *in_RSI;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_30;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_28;
  X *local_20;
  gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> *this_local;
  
  this_local = this;
  if (((ulong)in_RSI[1].
              super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
              _M_impl.super__Vector_impl_data._M_finish & 1) == 0) {
    *(undefined1 *)
     &in_RSI[1].super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
      _M_impl.super__Vector_impl_data._M_finish = 1;
    local_20 = (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::
                    begin(in_RSI);
    in_RSI[1].super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
    _M_impl.super__Vector_impl_data._M_start = local_20;
  }
  else {
    local_28._M_current =
         (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                        (in_RSI);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                        *)(in_RSI + 1),&local_28);
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
      ::operator++((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                    *)(in_RSI + 1));
    }
  }
  local_30._M_current =
       (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                      (in_RSI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                      *)(in_RSI + 1),&local_30);
  if (bVar1) {
    maybe<rangeless::fn::impl::X>::maybe((maybe<rangeless::fn::impl::X> *)this);
  }
  else {
    pXVar2 = __gnu_cxx::
             __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
             ::operator*((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                          *)(in_RSI + 1));
    maybe<rangeless::fn::impl::X>::maybe((maybe<rangeless::fn::impl::X> *)this,(X)pXVar2->value);
  }
  return (maybe<rangeless::fn::impl::X>)this;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    started = true;
                    it = inps.begin(); 
                        // r might not be a container (i.e. some input-range
                        // and begin()  may be non-const, so deferring until
                        // the first call to operator() rather than
                        // initializing it{ r.begin() } in constructor.
                } else if(it == inps.end()) {
                    ; // may be equal to end in case of repeated calls to operator() after ended
                } else {
                    ++it;
                }

                if(it == inps.end()) {
                    return { };
                } else {
                    return { std::move(*it) };
                }
            }